

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::helper::
     heapsort<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator SA,
               value_type size)

{
  iterator __b;
  iterator __b_00;
  iterator SA_00;
  iterator SA_01;
  iterator SA_02;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_00;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_01;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td_02;
  value_type vVar1;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *this;
  long in_RDX;
  BitmapArray<long> *in_RSI;
  long in_RDI;
  reference rVar2;
  pos_type t;
  pos_type m;
  pos_type i;
  value_reference *in_stack_fffffffffffffe88;
  value_reference *in_stack_fffffffffffffe90;
  iterator *in_stack_fffffffffffffe98;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  pos_type *ppVar3;
  iterator in_stack_fffffffffffffeb8;
  undefined1 in_stack_ffffffffffffff10 [16];
  long size_00;
  pos_type size_01;
  long in_stack_ffffffffffffff20;
  BitmapArray<long> *in_stack_ffffffffffffff28;
  value_reference *in_stack_ffffffffffffff30;
  iterator *in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  long local_28;
  long local_20;
  
  ppVar3 = (pos_type *)&stack0x00000008;
  local_28 = in_RDX;
  if (in_RDX % 2 == 0) {
    local_28 = in_RDX + -1;
    bitmap::BitmapArray<long>::iterator::operator[]
              ((iterator *)in_stack_fffffffffffffea0,(difference_type)in_stack_fffffffffffffe98);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1192eb);
    vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffeac = (int)vVar1;
    bitmap::BitmapArray<long>::iterator::operator[]
              ((iterator *)in_stack_fffffffffffffea0,(difference_type)in_stack_fffffffffffffe98);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x119331);
    vVar1 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
    if (in_stack_fffffffffffffeac < vVar1) {
      bitmap::BitmapArray<long>::iterator::operator+
                (in_stack_fffffffffffffe98,(difference_type)in_stack_fffffffffffffe90);
      bitmap::BitmapArray<long>::iterator::operator+
                (in_stack_fffffffffffffe98,(difference_type)in_stack_fffffffffffffe90);
      __b.array_._4_4_ = in_stack_fffffffffffffeac;
      __b.array_._0_4_ = in_stack_fffffffffffffea8;
      __b.pos_ = (pos_type)ppVar3;
      std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                (in_stack_fffffffffffffeb8,__b);
    }
  }
  local_20 = local_28 / 2;
  while( true ) {
    size_00 = in_stack_ffffffffffffff10._8_8_;
    local_20 = local_20 + -1;
    if (local_20 < 0) break;
    in_stack_fffffffffffffe88 = (value_reference *)*ppVar3;
    in_stack_fffffffffffffe90 = (value_reference *)ppVar3[1];
    in_stack_fffffffffffffe98 = (iterator *)ppVar3[2];
    Td_00.m_PA = in_stack_ffffffffffffff48;
    Td_00.m_Td = (char *)in_stack_ffffffffffffff40;
    SA_00.pos_ = (pos_type)in_stack_ffffffffffffff30;
    SA_00.array_ = in_stack_ffffffffffffff28;
    fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
              (Td_00,SA_00,in_stack_ffffffffffffff20,size_00);
  }
  local_20 = local_28;
  if (in_RDX % 2 == 0) {
    in_stack_ffffffffffffff48 =
         bitmap::BitmapArray<long>::iterator::operator+
                   (in_stack_fffffffffffffe98,(difference_type)in_stack_fffffffffffffe90);
    __b_00.array_._4_4_ = in_stack_fffffffffffffeac;
    __b_00.array_._0_4_ = in_stack_fffffffffffffea8;
    __b_00.pos_ = (pos_type)ppVar3;
    std::iter_swap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (in_stack_fffffffffffffeb8,__b_00);
    in_stack_fffffffffffffe88 = (value_reference *)*ppVar3;
    in_stack_fffffffffffffe90 = (value_reference *)ppVar3[1];
    in_stack_fffffffffffffe98 = (iterator *)ppVar3[2];
    Td_01.m_PA = in_stack_ffffffffffffff48;
    Td_01.m_Td = (char *)in_stack_fffffffffffffe98;
    SA_01.pos_ = (pos_type)in_stack_fffffffffffffe88;
    SA_01.array_ = in_RSI;
    in_stack_ffffffffffffff30 = in_stack_fffffffffffffe88;
    in_stack_ffffffffffffff40 = in_stack_fffffffffffffe98;
    fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
              (Td_01,SA_01,in_RDI,size_00);
    in_stack_ffffffffffffff20 = in_RDI;
    in_stack_ffffffffffffff28 = in_RSI;
  }
  while (local_20 = local_20 + -1, 0 < local_20) {
    rVar2 = bitmap::BitmapArray<long>::iterator::operator[]
                      ((iterator *)in_stack_fffffffffffffea0,
                       (difference_type)in_stack_fffffffffffffe98);
    size_01 = rVar2.pos_;
    this = (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)
           bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1195fe);
    bitmap::BitmapArray<long>::iterator::operator[]
              ((iterator *)in_stack_fffffffffffffea0,(difference_type)in_stack_fffffffffffffe98);
    bitmap::BitmapArray<long>::iterator::operator[]
              ((iterator *)in_stack_fffffffffffffea0,(difference_type)in_stack_fffffffffffffe98);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    in_stack_fffffffffffffe88 = (value_reference *)*ppVar3;
    in_stack_fffffffffffffe90 = (value_reference *)ppVar3[1];
    in_stack_fffffffffffffe98 = (iterator *)ppVar3[2];
    Td_02.m_PA = in_stack_ffffffffffffff48;
    Td_02.m_Td = (char *)in_stack_ffffffffffffff40;
    SA_02.pos_ = (pos_type)in_stack_ffffffffffffff30;
    SA_02.array_ = in_stack_ffffffffffffff28;
    fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
              (Td_02,SA_02,in_stack_ffffffffffffff20,size_01);
    bitmap::BitmapArray<long>::iterator::operator[]
              ((iterator *)this,(difference_type)in_stack_fffffffffffffe98);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_fffffffffffffe90,(long)in_stack_fffffffffffffe88);
    in_stack_fffffffffffffea0 = this;
  }
  return;
}

Assistant:

void heapsort(const StringIterator_type Td, SAIterator_type SA,
              typename std::iterator_traits<SAIterator_type>::value_type size) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  pos_type i, m;
  pos_type t;

  m = size;
  if ((size % 2) == 0) {
    m--;
    if (Td[SA[m / 2]] < Td[SA[m]]) {
      std::iter_swap(SA + m, SA + m / 2);
    }
  }

  for (i = m / 2 - 1; 0 <= i; --i) {
    fixdown(Td, SA, i, m);
  }

  if ((size % 2) == 0) {
    std::iter_swap(SA, SA + m);
    fixdown(Td, SA, pos_type(0), m);
  }

  for (i = m - 1; 0 < i; --i) {
    t = SA[0];
    SA[0] = SA[i];
    fixdown(Td, SA, pos_type(0), i);
    SA[i] = t;
  }
}